

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::RemoveMarker(ChBody *this,shared_ptr<chrono::ChMarker> *mmarker)

{
  shared_ptr<chrono::ChMarker> *psVar1;
  ChSystem *pCVar2;
  __normal_iterator<std::shared_ptr<chrono::ChMarker>_*,_std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
  _Var3;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChMarker>const>>
                    ((this->marklist).
                     super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->marklist).
                     super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,mmarker);
  psVar1 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current != psVar1) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChMarker>const>>
                      ((this->marklist).
                       super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,psVar1,mmarker);
    std::
    vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
    erase(&this->marklist,(const_iterator)_Var3._M_current);
    ((mmarker->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
         (ChBody *)0x0;
    pCVar2 = (this->super_ChPhysicsItem).system;
    if (pCVar2 != (ChSystem *)0x0) {
      pCVar2->is_updated = false;
    }
    return;
  }
  __assert_fail("std::find<std::vector<std::shared_ptr<ChMarker>>::iterator>(marklist.begin(), marklist.end(), mmarker) != marklist.end()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBody.cpp"
                ,0x21b,"void chrono::ChBody::RemoveMarker(std::shared_ptr<ChMarker>)");
}

Assistant:

void ChBody::RemoveMarker(std::shared_ptr<ChMarker> mmarker) {
    // trying to remove objects not previously added?
    assert(std::find<std::vector<std::shared_ptr<ChMarker>>::iterator>(marklist.begin(), marklist.end(), mmarker) !=
           marklist.end());

    // warning! linear time search
    marklist.erase(
        std::find<std::vector<std::shared_ptr<ChMarker>>::iterator>(marklist.begin(), marklist.end(), mmarker));

    mmarker->SetBody(0);

    // If the body is already added to a system, mark the system out-of-date
    if (system) {
        system->is_updated = false;
    }
}